

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  uint uVar1;
  Curl_easy *data_00;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  uint scope;
  CURLcode CVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  curltime cVar9;
  bool local_141;
  undefined4 uStack_11c;
  undefined4 local_118;
  bool local_111;
  int optval;
  _Bool is_tcp;
  long port;
  char ipaddress [46];
  CURLcode result;
  curl_socket_t sockfd;
  Curl_easy *data;
  int iStack_bc;
  _Bool isconnected;
  int error;
  int rc;
  Curl_sockaddr_ex addr;
  curl_socket_t *sockp_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  
  bVar2 = false;
  data_00 = conn->data;
  local_118 = 1;
  *sockp = -1;
  addr._sa_ex_u._120_8_ = sockp;
  ipaddress._40_4_ =
       Curl_socket(conn,ai,(Curl_sockaddr_ex *)&error,(curl_socket_t *)(ipaddress + 0x2c));
  if (ipaddress._40_4_ == CURLE_OK) {
    _Var3 = Curl_getaddressinfo((sockaddr *)&addr.protocol,(char *)&port,(long *)&optval);
    if (_Var3) {
      Curl_infof(data_00,"  Trying %s...\n",&port);
      if ((error == 2) || (local_141 = false, error == 10)) {
        local_141 = rc == 1;
      }
      local_111 = local_141;
      if ((local_141 != false) && (((data_00->set).tcp_nodelay & 1U) != 0)) {
        Curl_tcpnodelay(conn,stack0xffffffffffffff2c);
      }
      if (((local_111 & 1U) != 0) && (((data_00->set).tcp_keepalive & 1U) != 0)) {
        tcpkeepalive(data_00,stack0xffffffffffffff2c);
      }
      if ((data_00->set).fsockopt != (curl_sockopt_callback)0x0) {
        Curl_set_in_callback(data_00,true);
        iVar4 = (*(data_00->set).fsockopt)
                          ((data_00->set).sockopt_client,stack0xffffffffffffff2c,CURLSOCKTYPE_IPCXN)
        ;
        Curl_set_in_callback(data_00,false);
        if (iVar4 == 2) {
          bVar2 = true;
        }
        else if (iVar4 != 0) {
          Curl_closesocket(conn,stack0xffffffffffffff2c);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      uVar1 = stack0xffffffffffffff2c;
      if ((error == 2) || (error == 10)) {
        scope = Curl_ipv6_scope((sockaddr *)&addr.protocol);
        ipaddress._40_4_ = bindlocal(conn,uVar1,error,scope);
        if (ipaddress._40_4_ != CURLE_OK) {
          Curl_closesocket(conn,stack0xffffffffffffff2c);
          if (ipaddress._40_4_ == 1) {
            return CURLE_COULDNT_CONNECT;
          }
          CVar5._0_1_ = ipaddress[0x28];
          CVar5._1_1_ = ipaddress[0x29];
          CVar5._2_1_ = ipaddress[0x2a];
          CVar5._3_1_ = ipaddress[0x2b];
          return CVar5;
        }
      }
      curlx_nonblock(stack0xffffffffffffff2c,1);
      cVar9 = Curl_now();
      (conn->connecttime).tv_sec = cVar9.tv_sec;
      *(ulong *)&(conn->connecttime).tv_usec = CONCAT44(uStack_11c,cVar9.tv_usec);
      if (1 < conn->num_addr) {
        Curl_expire(data_00,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
      }
      if ((bVar2) || (conn->socktype != 1)) {
        *(uint *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        if (((conn->bits).tcp_fastopen & 1U) == 0) {
          iStack_bc = connect(stack0xffffffffffffff2c,(sockaddr *)&addr.protocol,addr.socktype);
        }
        else {
          iVar4 = setsockopt(stack0xffffffffffffff2c,6,0x1e,&local_118,4);
          if (iVar4 < 0) {
            Curl_infof(data_00,"Failed to enable TCP Fast Open on fd %d\n",
                       (ulong)stack0xffffffffffffff2c);
          }
          else {
            Curl_infof(data_00,"TCP_FASTOPEN_CONNECT set\n");
          }
          iStack_bc = connect(stack0xffffffffffffff2c,(sockaddr *)&addr.protocol,addr.socktype);
        }
        if (iStack_bc == -1) {
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          if ((iVar4 == 0xb) || (iVar4 == 0x73)) {
            ipaddress[0x28] = '\0';
            ipaddress[0x29] = '\0';
            ipaddress[0x2a] = '\0';
            ipaddress[0x2b] = '\0';
          }
          else {
            pcVar8 = Curl_strerror(conn,iVar4);
            Curl_infof(data_00,"Immediate connect fail for %s: %s\n",&port,pcVar8);
            (data_00->state).os_errno = iVar4;
            Curl_closesocket(conn,stack0xffffffffffffff2c);
            ipaddress[0x28] = '\a';
            ipaddress[0x29] = '\0';
            ipaddress[0x2a] = '\0';
            ipaddress[0x2b] = '\0';
          }
        }
        if (ipaddress._40_4_ == 0) {
          *(uint *)addr._sa_ex_u._120_8_ = stack0xffffffffffffff2c;
        }
        conn_local._4_1_ = ipaddress[0x28];
        conn_local._5_1_ = ipaddress[0x29];
        conn_local._6_1_ = ipaddress[0x2a];
        conn_local._7_1_ = ipaddress[0x2b];
      }
    }
    else {
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      piVar7 = __errno_location();
      pcVar8 = Curl_strerror(conn,*piVar7);
      Curl_failf(data_00,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar8);
      Curl_closesocket(conn,stack0xffffffffffffff2c);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!Curl_getaddressinfo((struct sockaddr*)&addr.sa_addr,
                          ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(conn, errno));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}